

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmList.cxx
# Opt level: O2

cmList * __thiscall
cmList::transform(cmList *this,TransformAction action,string *arg1,string *arg2,
                 unique_ptr<cmList::TransformSelector,_std::default_delete<cmList::TransformSelector>_>
                 *selector)

{
  TransformSelector *pTVar1;
  iterator descriptor;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  
  descriptor = anon_unknown.dwarf_9e8bb::TransformConfigure(action,selector,2);
  (**(code **)(*(long *)descriptor._M_node[2]._M_left + 0x18))
            (descriptor._M_node[2]._M_left,
             (selector->_M_t).
             super___uniq_ptr_impl<cmList::TransformSelector,_std::default_delete<cmList::TransformSelector>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmList::TransformSelector_*,_std::default_delete<cmList::TransformSelector>_>
             .super__Head_base<0UL,_cmList::TransformSelector_*,_false>._M_head_impl,arg1,arg2);
  pTVar1 = (selector->_M_t).
           super___uniq_ptr_impl<cmList::TransformSelector,_std::default_delete<cmList::TransformSelector>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmList::TransformSelector_*,_std::default_delete<cmList::TransformSelector>_>
           .super__Head_base<0UL,_cmList::TransformSelector_*,_false>._M_head_impl;
  local_48._8_8_ = 0;
  local_30 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmList.cxx:782:19)>
             ::_M_invoke;
  local_38 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmList.cxx:782:19)>
             ::_M_manager;
  local_48._M_unused._M_object = &descriptor;
  (*pTVar1->_vptr_TransformSelector[5])(pTVar1,this);
  std::_Function_base::~_Function_base((_Function_base *)&local_48);
  return this;
}

Assistant:

cmList& cmList::transform(TransformAction action, std::string const& arg1,
                          std::string const& arg2,
                          std::unique_ptr<TransformSelector> selector)
{
  auto descriptor = TransformConfigure(action, selector, 2);

  descriptor->Transform->Initialize(
    static_cast<::TransformSelector*>(selector.get()), arg1, arg2);

  static_cast<::TransformSelector&>(*selector).Transform(
    this->Values, [&descriptor](const std::string& s) -> std::string {
      return (*descriptor->Transform)(s);
    });

  return *this;
}